

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

ElOrderType M_GetElOrder(Matrix *M)

{
  LASErrIdType LVar1;
  ElOrderType local_14;
  ElOrderType ElOrder;
  Matrix *M_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    local_14 = M->ElOrder;
  }
  else {
    local_14 = Rowws;
  }
  return local_14;
}

Assistant:

ElOrderType M_GetElOrder(Matrix *M)
/* returns the element order */
{
    ElOrderType ElOrder;

    if (LASResult() == LASOK) {
        ElOrder = M->ElOrder;
    } else {
        ElOrder = (ElOrderType)0;
    }
    return(ElOrder);
}